

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall
GlobOpt::CaptureArguments
          (GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo,JitArenaAllocator *allocator)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  SymID id;
  BVUnitT<unsigned_long> local_48;
  SparseBVUnit _unit;
  BVSparse<Memory::JitArenaAllocator> *local_38;
  
  local_38 = (this->currentBlock->globOptData).argObjSyms;
  _unit.word = (Type)bailOutInfo;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    local_38 = (BVSparse<Memory::JitArenaAllocator> *)local_38->head;
    if (local_38 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      return;
    }
    TVar1 = *(Type *)&local_38->lastFoundIndex;
    local_48.word = ((Type *)&local_38->alloc)->word;
    while (local_48.word != 0) {
      lVar2 = 0;
      if (local_48.word != 0) {
        for (; (local_48.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      id = TVar1 + (BVIndex)lVar2;
      BVUnitT<unsigned_long>::Clear(&local_48,(BVIndex)lVar2);
      pSVar6 = SymTable::FindStackSym(this->func->m_symTable,id);
      if (pSVar6 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x123,"(stackSym != nullptr)","stackSym != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      if ((pSVar6->field_0x19 & 0x20) != 0) {
        this_00 = *(BVSparse<Memory::JitArenaAllocator> **)(*(long *)(_unit.word + 0x18) + 0x20);
        if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
          this_00->head = (Type_conflict)0x0;
          this_00->lastFoundIndex = (Type_conflict)0x0;
          this_00->alloc = allocator;
          this_00->lastUsedNodePrevNextField = (Type)this_00;
          *(BVSparse<Memory::JitArenaAllocator> **)(*(long *)(_unit.word + 0x18) + 0x20) = this_00;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(this_00,id);
      }
    }
  } while( true );
}

Assistant:

void
GlobOpt::CaptureArguments(BasicBlock *block, BailOutInfo * bailOutInfo, JitArenaAllocator *allocator)
{
    FOREACH_BITSET_IN_SPARSEBV(id, this->currentBlock->globOptData.argObjSyms)
    {
        StackSym * stackSym = this->func->m_symTable->FindStackSym(id);
        Assert(stackSym != nullptr);
        if (!stackSym->HasByteCodeRegSlot())
        {
            continue;
        }

        if (!bailOutInfo->capturedValues->argObjSyms)
        {
            bailOutInfo->capturedValues->argObjSyms = JitAnew(allocator, BVSparse<JitArenaAllocator>, allocator);
        }

        bailOutInfo->capturedValues->argObjSyms->Set(id);
        // Add to BailOutInfo
    }
    NEXT_BITSET_IN_SPARSEBV
}